

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

char * minimum_size_type(int lwr,int upr,int *pnByte)

{
  char *pcVar1;
  int iVar2;
  bool bVar3;
  
  if (lwr < 0) {
    if (0xffffff80 < (uint)lwr && upr < 0x80) {
      iVar2 = 1;
      pcVar1 = "signed char";
      goto LAB_0010b0bc;
    }
    pcVar1 = "int";
    if (0x7ffe >= upr && (uint)lwr >= 0xffff8001) {
      pcVar1 = "short";
    }
    bVar3 = 0x7ffe < upr || (uint)lwr < 0xffff8001;
  }
  else {
    if (upr < 0x100) {
      iVar2 = 1;
      pcVar1 = "unsigned char";
      goto LAB_0010b0bc;
    }
    bVar3 = 0xfffe < (uint)upr;
    pcVar1 = "unsigned int";
    if (!bVar3) {
      pcVar1 = "unsigned short int";
    }
  }
  iVar2 = (uint)bVar3 * 2 + 2;
LAB_0010b0bc:
  if (pnByte != (int *)0x0) {
    *pnByte = iVar2;
  }
  return pcVar1;
}

Assistant:

static const char *minimum_size_type(int lwr, int upr, int *pnByte){
  const char *zType = "int";
  int nByte = 4;
  if( lwr>=0 ){
    if( upr<=255 ){
      zType = "unsigned char";
      nByte = 1;
    }else if( upr<65535 ){
      zType = "unsigned short int";
      nByte = 2;
    }else{
      zType = "unsigned int";
      nByte = 4;
    }
  }else if( lwr>=-127 && upr<=127 ){
    zType = "signed char";
    nByte = 1;
  }else if( lwr>=-32767 && upr<32767 ){
    zType = "short";
    nByte = 2;
  }
  if( pnByte ) *pnByte = nByte;
  return zType;
}